

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::Action::~Action(Action *this)

{
  Action *this_local;
  
  ~Action(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Action() = default;